

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseConst(JSONParser *this,TypedValue *out_value)

{
  bool bVar1;
  Result result;
  undefined1 local_50 [8];
  ExpectedValue expected;
  TypedValue *out_value_local;
  JSONParser *this_local;
  
  expected.nan._8_8_ = out_value;
  ExpectedValue::ExpectedValue((ExpectedValue *)local_50);
  result = ParseExpectedValue(this,(ExpectedValue *)local_50,No);
  bVar1 = wabt::Failed(result);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    *(undefined1 (*) [8])expected.nan._8_8_ = local_50;
    *(ValueType *)(expected.nan._8_8_ + 8) = expected.value.type;
    *(u64 *)(expected.nan._8_8_ + 0x10) = expected.value.value.field_0.i64_;
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseConst(TypedValue* out_value) {
  ExpectedValue expected;
  CHECK_RESULT(ParseExpectedValue(&expected, AllowExpected::No));
  *out_value = expected.value;
  return wabt::Result::Ok;
}